

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall
FMultiBlockThingsIterator::FMultiBlockThingsIterator
          (FMultiBlockThingsIterator *this,FPortalGroupArray *check,double checkx,double checky,
          double checkz,double checkh,double checkradius,bool ignorerestricted,sector_t *newsec)

{
  short sVar1;
  
  this->checklist = check;
  FBlockThingsIterator::FBlockThingsIterator(&this->blockIterator);
  (this->bbox).m_Box[2] = 3.4028234663852886e+38;
  (this->bbox).m_Box[3] = -3.4028234663852886e+38;
  (this->bbox).m_Box[0] = -3.4028234663852886e+38;
  (this->bbox).m_Box[1] = 3.4028234663852886e+38;
  (this->checkpoint).X = checkx;
  (this->checkpoint).Y = checky;
  (this->checkpoint).Z = checkz;
  if (newsec == (sector_t *)0x0) {
    newsec = (sector_t *)P_PointInSector(checkx,checky);
  }
  sVar1 = (short)((sector_t_conflict *)newsec)->PortalGroup;
  this->basegroup = sVar1;
  if (check->inited == false) {
    P_CollectConnectedGroups
              ((int)sVar1,&this->checkpoint,checkz + checkh,checkradius,this->checklist);
  }
  (this->checkpoint).Z = checkradius;
  Reset(this);
  return;
}

Assistant:

FMultiBlockThingsIterator::FMultiBlockThingsIterator(FPortalGroupArray &check, double checkx, double checky, double checkz, double checkh, double checkradius, bool ignorerestricted, sector_t *newsec)
	: checklist(check)
{
	checkpoint.X = checkx;
	checkpoint.Y = checky;
	checkpoint.Z = checkz;
	if (newsec == NULL) newsec = P_PointInSector(checkx, checky);
	basegroup = newsec->PortalGroup;
	if (!check.inited) P_CollectConnectedGroups(basegroup, checkpoint, checkz + checkh, checkradius, checklist);
	checkpoint.Z = checkradius;
	Reset();
}